

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O0

Graph * Omega_h::unmap_graph(Graph *__return_storage_ptr__,LOs *a2b,Graph *b2c)

{
  int size_in;
  Write<int> local_1f8;
  Read<int> local_1e8;
  Read<int> local_1d8;
  undefined1 local_1c8 [8];
  type f;
  string local_170 [32];
  undefined1 local_150 [8];
  Write<int> ac2c;
  LO na;
  Read<int> local_118;
  undefined1 local_108 [8];
  LOs a2ac;
  Read<int> local_e8;
  Write<int> local_d8;
  undefined1 local_c8 [8];
  Read<int> a_degrees;
  string local_b0 [32];
  Read<int> local_90;
  undefined1 local_80 [8];
  LOs b_degrees;
  undefined1 local_60 [8];
  LOs bc2c;
  LOs b2bc;
  Graph *b2c_local;
  LOs *a2b_local;
  ulong local_10;
  
  Read<int>::Read((Read<int> *)&bc2c.write_.shared_alloc_.direct_ptr,&b2c->a2ab);
  Read<int>::Read((Read<int> *)local_60,&b2c->ab2b);
  Read<int>::Read(&local_90,(Read<int> *)&bc2c.write_.shared_alloc_.direct_ptr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,"",(allocator *)((long)&a_degrees.write_.shared_alloc_.direct_ptr + 7));
  get_degrees((Omega_h *)local_80,&local_90,(string *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&a_degrees.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::~Read(&local_90);
  Read<int>::Read(&local_e8,a2b);
  Read<int>::Read((Read<int> *)&a2ac.write_.shared_alloc_.direct_ptr,(Read<int> *)local_80);
  unmap<int>((Omega_h *)&local_d8,&local_e8,(Read<int> *)&a2ac.write_.shared_alloc_.direct_ptr,1);
  read<int>((Omega_h *)local_c8,&local_d8);
  Write<int>::~Write(&local_d8);
  Read<int>::~Read((Read<int> *)&a2ac.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_e8);
  Read<int>::Read(&local_118,(Read<int> *)local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&na,"",(allocator *)((long)&ac2c.shared_alloc_.direct_ptr + 7));
  offset_scan<int>((Omega_h *)local_108,&local_118,(string *)&na);
  std::__cxx11::string::~string((string *)&na);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ac2c.shared_alloc_.direct_ptr + 7));
  Read<int>::~Read(&local_118);
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  ac2c.shared_alloc_.direct_ptr._0_4_ = (LO)(local_10 >> 2);
  size_in = Read<int>::last((Read<int> *)local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_170,"",(allocator *)((long)&f.bc2c.write_.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_150,size_in,(string *)local_170);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.bc2c.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)local_1c8,a2b);
  Read<int>::Read((Read<int> *)&f.a2b.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&bc2c.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.b2bc.write_.shared_alloc_.direct_ptr,(Read<int> *)local_108);
  Write<int>::Write((Write<int> *)&f.a2ac.write_.shared_alloc_.direct_ptr,(Write<int> *)local_150);
  Read<int>::Read((Read<int> *)&f.ac2c.shared_alloc_.direct_ptr,(Read<int> *)local_60);
  parallel_for<Omega_h::unmap_graph(Omega_h::Read<int>,Omega_h::Graph)::__0>
            ((LO)ac2c.shared_alloc_.direct_ptr,(type *)local_1c8,"unmap_graph");
  Read<int>::Read(&local_1d8,(Read<int> *)local_108);
  Write<int>::Write(&local_1f8,(Write<int> *)local_150);
  Read<int>::Read(&local_1e8,&local_1f8);
  Graph::Graph(__return_storage_ptr__,&local_1d8,&local_1e8);
  Read<int>::~Read(&local_1e8);
  Write<int>::~Write(&local_1f8);
  Read<int>::~Read(&local_1d8);
  unmap_graph(Omega_h::Read<int>,Omega_h::Graph)::$_0::~__0((__0 *)local_1c8);
  Write<int>::~Write((Write<int> *)local_150);
  Read<int>::~Read((Read<int> *)local_108);
  Read<int>::~Read((Read<int> *)local_c8);
  Read<int>::~Read((Read<int> *)local_80);
  Read<int>::~Read((Read<int> *)local_60);
  Read<int>::~Read((Read<int> *)&bc2c.write_.shared_alloc_.direct_ptr);
  return __return_storage_ptr__;
}

Assistant:

Graph unmap_graph(LOs a2b, Graph b2c) {
  auto b2bc = b2c.a2ab;
  auto bc2c = b2c.ab2b;
  auto b_degrees = get_degrees(b2bc);
  auto a_degrees = read(unmap(a2b, b_degrees, 1));
  auto a2ac = offset_scan(a_degrees);
  auto na = a2b.size();
  Write<LO> ac2c(a2ac.last());
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    auto bc = b2bc[b];
    for (auto ac = a2ac[a]; ac < a2ac[a + 1]; ++ac) {
      ac2c[ac] = bc2c[bc++];
    }
  };
  parallel_for(na, f, "unmap_graph");
  return Graph(a2ac, ac2c);
}